

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall
cppcms::http::context::context(context *this,shared_ptr<cppcms::impl::cgi::connection> *conn)

{
  _data *p_Var1;
  context *this_00;
  string *skin;
  noncopyable *in_RDI;
  context *in_stack_000000a8;
  response *in_stack_000000b0;
  pointer in_stack_ffffffffffffff68;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffff70;
  _data *in_stack_ffffffffffffff78;
  unique_ptr<cppcms::http::response,_std::default_delete<cppcms::http::response>_> *this_01;
  hold_ptr<cppcms::http::context::_data> *in_stack_ffffffffffffff80;
  string local_40 [8];
  context *in_stack_ffffffffffffffc8;
  _data *in_stack_ffffffffffffffd0;
  
  booster::noncopyable::noncopyable(in_RDI);
  std::enable_shared_from_this<cppcms::http::context>::enable_shared_from_this
            ((enable_shared_from_this<cppcms::http::context> *)0x3a0558);
  booster::hold_ptr<cppcms::http::context::_data>::hold_ptr
            ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
            (in_stack_ffffffffffffff70,
             (shared_ptr<cppcms::impl::cgi::connection> *)in_stack_ffffffffffffff68);
  operator_new(0x150);
  _data::_data(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  booster::hold_ptr<cppcms::http::context::_data>::reset
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  p_Var1 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                     ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  this_01 = &p_Var1->response;
  operator_new(0x20);
  http::response::response(in_stack_000000b0,in_stack_000000a8);
  std::unique_ptr<cppcms::http::response,_std::default_delete<cppcms::http::response>_>::reset
            ((unique_ptr<cppcms::http::response,_std::default_delete<cppcms::http::response>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (context *)service((context *)0x3a0626);
  skin = (string *)cppcms::service::views_pool((service *)0x3a0637);
  views::manager::default_skin_abi_cxx11_((manager *)this_01);
  context::skin(this_00,skin);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

context::context(booster::shared_ptr<impl::cgi::connection> conn) :
	conn_(conn)
{
	d.reset(new _data(*this));
	d->response.reset(new http::response(*this));
	skin(service().views_pool().default_skin());
}